

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,Ptr<const_Catch::IConfig> *_fullConfig)

{
  IConfig *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(_fullConfig->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar2);
  pIVar1 = _fullConfig->m_p;
  (this->m_fullConfig).m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
    return;
  }
  return;
}

Assistant:

explicit ReporterConfig( Ptr<IConfig const> const& _fullConfig )
        :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}